

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_mesh.cpp
# Opt level: O0

bool dxil_spv::emit_dispatch_mesh_instruction(Impl *impl,CallInst *instruction)

{
  Id arg;
  Operation *op_00;
  Value *value;
  undefined4 local_24;
  uint i;
  Operation *op;
  CallInst *instruction_local;
  Impl *impl_local;
  
  op_00 = Converter::Impl::allocate(impl,OpEmitMeshTasksEXT);
  for (local_24 = 1; local_24 < 5; local_24 = local_24 + 1) {
    value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,local_24);
    arg = Converter::Impl::get_id_for_value(impl,value,0);
    Operation::add_id(op_00,arg);
  }
  Converter::Impl::add(impl,op_00,false);
  return true;
}

Assistant:

bool emit_dispatch_mesh_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	Operation *op = impl.allocate(spv::OpEmitMeshTasksEXT);

	for (unsigned i = 1; i <= 4; i++)
		op->add_id(impl.get_id_for_value(instruction->getOperand(i)));

	impl.add(op);
	return true;
}